

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void __thiscall Kuhn::Game::reset(Game *this,bool skipChanceAction)

{
  value_type_conflict2 vVar1;
  value_type_conflict2 vVar2;
  reference pvVar3;
  size_type sVar4;
  result_type_conflict1 rVar5;
  int iVar6;
  int local_28;
  int i_1;
  int tmp;
  int c2;
  int c1;
  int i;
  bool skipChanceAction_local;
  Game *this_local;
  
  if (skipChanceAction) {
    for (c2 = 0; c2 < 3; c2 = c2 + 1) {
      pvVar3 = std::array<int,_3UL>::operator[](&this->mCards,(long)c2);
      *pvVar3 = c2;
    }
    sVar4 = std::array<int,_3UL>::size(&this->mCards);
    iVar6 = (int)sVar4;
    while (tmp = iVar6 + -1, 0 < tmp) {
      rVar5 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this->mEngine);
      iVar6 = (int)((long)((ulong)(uint)((int)rVar5 >> 0x1f) << 0x20 | rVar5 & 0xffffffff) %
                   (long)iVar6);
      pvVar3 = std::array<int,_3UL>::operator[](&this->mCards,(long)tmp);
      vVar1 = *pvVar3;
      pvVar3 = std::array<int,_3UL>::operator[](&this->mCards,(long)iVar6);
      vVar2 = *pvVar3;
      pvVar3 = std::array<int,_3UL>::operator[](&this->mCards,(long)tmp);
      *pvVar3 = vVar2;
      pvVar3 = std::array<int,_3UL>::operator[](&this->mCards,(long)iVar6);
      *pvVar3 = vVar1;
      iVar6 = tmp;
    }
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      pvVar3 = std::array<int,_3UL>::operator[](&this->mCards,(long)local_28);
      this->mInfoSets[local_28][0] = (uint8_t)*pvVar3;
    }
    this->mTurnNum = 0;
    this->mCurrentPlayer = 0;
    this->mFirstBetTurn = -1;
    this->mBetPlayerNum = 0;
    this->mDone = false;
  }
  else {
    this->mCurrentPlayer = 3;
  }
  return;
}

Assistant:

void Game::reset(bool skipChanceAction) {
    if (!skipChanceAction) {
        mCurrentPlayer = PlayerNum + 1;
        return;
    }

    for (int i = 0; i < CardNum; ++i) {
        mCards[i] = i;
    }
    // shuffle cards
    for (int c1 = int(mCards.size()) - 1; c1 > 0; --c1) {
        const int c2 = int(mEngine()) % (c1 + 1);
        const int tmp = mCards[c1];
        mCards[c1] = mCards[c2];
        mCards[c2] = tmp;
    }
    for (int i = 0; i < PlayerNum; ++i) {
        mInfoSets[i][0] = mCards[i];
    }
    mTurnNum = 0;
    mCurrentPlayer = 0;
    mFirstBetTurn = -1;
    mBetPlayerNum = 0;
    mDone = false;
}